

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numheader.c
# Opt level: O2

int32_t numheader_encode16(uint8_t *buf,int32_t maxBufLen,uint16_t value)

{
  int32_t iVar1;
  
  if (0x807f < value || (maxBufLen == 0 || buf == (uint8_t *)0x0)) {
    return -1;
  }
  if (value < 0x80) {
    *buf = (uint8_t)value;
    iVar1 = 1;
  }
  else {
    if (maxBufLen < 2) {
      return -1;
    }
    *buf = (byte)(value >> 8) | 0x80;
    buf[1] = (uint8_t)value;
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int32_t numheader_encode16(uint8_t *buf, int32_t maxBufLen, uint16_t value)
{
   int32_t retval = 0;
   if ( (buf == 0) || (maxBufLen == 0) || (value > NUMHEADER16_MAX_NUM_LONG) )
   {
      return -1;
   }
   if (value <= NUMHEADER16_MAX_NUM_SHORT)
   {
      retval = NUMHEADER16_SHORT_SIZE;
      buf[0]=(uint8_t) value; //encode 1-byte word with longbit set to 0
   }
   else
   {
      if(maxBufLen<(int32_t) sizeof(uint16_t))
      {
         return -1;
      }
      retval = NUMHEADER16_LONG_SIZE;
      //use the following trick to store values 32768-32895 into the 2-byte header as value 0-127 with longbit set to 1
      if(value>(uint16_t)32767u)
      {
         value-=(uint16_t)32768u;
      }
      buf[0]=((uint8_t)0x80) | ((uint8_t) (value>>((uint16_t)8u))); //encode 2-byte word with longbit set to 1
      buf[1]=(uint8_t) value;
   }
   return retval;
}